

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O1

void c219_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  byte bVar2;
  long lVar3;
  DEV_SMPL *pDVar4;
  DEV_SMPL *pDVar5;
  int iVar6;
  short sVar7;
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  byte *pbVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint *puVar16;
  ulong uVar17;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  lVar3 = *(long *)((long)param + 0x18);
  if (samples != 0 && lVar3 != 0) {
    pDVar4 = *outputs;
    pDVar5 = outputs[1];
    uVar10 = 0;
    do {
      uVar17 = 0;
      iVar11 = 0;
      iVar9 = 0;
      pbVar12 = (byte *)((long)param + 0x25);
      puVar16 = (uint *)((long)param + 0x424);
      do {
        if (((char)puVar16[6] != '\0') && (*(char *)((long)puVar16 + 0x19) == '\0')) {
          uVar15 = (uint)(ushort)puVar16[1] +
                   (uint)(ushort)(*(ushort *)(pbVar12 + -3) << 8 | *(ushort *)(pbVar12 + -3) >> 8);
          *(short *)(puVar16 + 1) = (short)uVar15;
          if (0xffff < uVar15) {
            *(undefined2 *)(puVar16 + 2) = *(undefined2 *)((long)puVar16 + 6);
            bVar1 = *pbVar12;
            if ((bVar1 & 4) == 0) {
              bVar2 = *(byte *)(lVar3 + (ulong)(((uint)*(byte *)((long)param +
                                                                (ulong)*(ushort *)
                                                                        ((long)&
                                                  find_sample_asic219banks +
                                                  (uVar17 >> 2 & 0x3fffffff) * 2) + 0x20) << 0x11 |
                                                *puVar16) & *(uint *)((long)param + 0x10)));
              if ((bVar1 & 1) == 0) {
                sVar7 = (ushort)bVar2 << 8;
              }
              else {
                sVar7 = *(short *)((long)param + (ulong)bVar2 * 2 + 0x222);
              }
              *(short *)((long)puVar16 + 6) = sVar7;
              uVar13 = *puVar16 + 1;
              *puVar16 = uVar13;
              if (uVar13 == puVar16[4]) {
                if ((bVar1 & 0x10) == 0) {
                  *(undefined1 *)(puVar16 + 6) = 0;
                  *(undefined2 *)((long)puVar16 + 6) = 0;
                }
                else {
                  *puVar16 = puVar16[5];
                }
              }
            }
            else {
              uVar8 = -(*(ushort *)((long)param + 0x220) & 1) & 0xfff6 ^
                      *(ushort *)((long)param + 0x220) >> 1;
              *(ushort *)((long)param + 0x220) = uVar8;
              *(ushort *)((long)puVar16 + 6) = uVar8;
            }
          }
          iVar14 = (int)(((long)*(short *)((long)puVar16 + 6) - (long)(short)puVar16[2]) *
                         (ulong)(uVar15 & 0xffff) >> 0x10) + (int)(short)puVar16[2];
          iVar6 = -iVar14;
          if ((*pbVar12 & 0x40) == 0) {
            iVar6 = iVar14;
          }
          iVar9 = iVar9 + (uint)pbVar12[-4] * iVar14;
          iVar11 = iVar11 + (uint)pbVar12[-5] * iVar6;
        }
        uVar17 = uVar17 + 1;
        puVar16 = puVar16 + 7;
        pbVar12 = pbVar12 + 0x10;
      } while (uVar17 != 0x10);
      pDVar4[uVar10] = pDVar4[uVar10] + (iVar9 >> 9);
      pDVar5[uVar10] = pDVar5[uVar10] + (iVar11 >> 9);
      uVar10 = uVar10 + 1;
    } while (uVar10 != samples);
  }
  return;
}

Assistant:

static void c219_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	c219_state *chip = (c219_state *)param;
	UINT32 i, j;

	DEV_SMPL out[2];

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (chip->pRom == NULL)
		return;

	for (i = 0; i < samples; i ++)
	{
		out[0] = out[1] = 0;

		for (j = 0; j < MAX_VOICE; j ++)
		{
			C219_VOICE* v = &chip->voi[j];
			const C219_VREGS* vreg = (C219_VREGS*)&chip->REG[j*16];

			if (v->key && ! v->Muted)
			{
				UINT32 frequency = (vreg->frequency_msb<<8) | vreg->frequency_lsb;
				INT32 newofs;
				INT32 s;

				newofs = v->pofs + frequency;
				v->pofs = newofs & 0xFFFF;
				if (newofs & 0x10000)
					c219_fetch_sample(chip, j);

				// Interpolate samples
				s = v->last_sample + (INT32)((INT64)v->pofs * (v->sample - v->last_sample) >> 16);

				if (vreg->mode & C219_MODE_INVERT)
					s = -s;
				out[0] += (((vreg->mode & C219_MODE_INVERT) ? -s : s) * vreg->volume_left);
				out[1] += (s * vreg->volume_right);
			}
		}

		outputs[0][i] += (out[0] >> 9);
		outputs[1][i] += (out[1] >> 9);
	}
}